

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void __thiscall
embree::avx2::
BVHNIntersector1<8,_16777232,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1MB>_>
::intersect(BVHNIntersector1<8,_16777232,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1MB>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  RayQueryContext *pRVar4;
  undefined8 uVar5;
  undefined1 (*pauVar6) [16];
  int iVar7;
  AABBNodeMB4D *node1;
  ulong uVar8;
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  Primitive *prim;
  undefined4 uVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined8 uVar27;
  undefined1 auVar28 [16];
  uint uVar29;
  uint uVar31;
  undefined1 auVar30 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_24e8) [16];
  Precalculations local_24d9;
  ulong local_24d8;
  ulong local_24d0;
  ulong local_24c8;
  ulong local_24c0;
  ulong local_24b8;
  RayQueryContext *local_24b0;
  ulong local_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar21 [64];
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    local_23a0 = *(long *)(*(long *)this + 0x70);
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      local_24e8 = (undefined1 (*) [16])local_2390;
      auVar22 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)((long)&This->leafIntersector + 4)));
      auVar25 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)&(This->intersector1).intersect));
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx((undefined1  [16])This->collider,auVar24);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      auVar24 = vcmpps_avx(auVar24,auVar33,1);
      auVar24 = vblendvps_avx((undefined1  [16])This->collider,auVar33,auVar24);
      auVar33 = vrcpps_avx(auVar24);
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = &DAT_3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar24 = vfnmadd231ps_fma(auVar34,auVar33,auVar24);
      auVar28 = vfmadd132ps_fma(auVar24,auVar33,auVar33);
      fVar32 = auVar28._0_4_;
      local_23c0._4_4_ = fVar32;
      local_23c0._0_4_ = fVar32;
      local_23c0._8_4_ = fVar32;
      local_23c0._12_4_ = fVar32;
      local_23c0._16_4_ = fVar32;
      local_23c0._20_4_ = fVar32;
      local_23c0._24_4_ = fVar32;
      local_23c0._28_4_ = fVar32;
      auVar40 = ZEXT3264(local_23c0);
      auVar24 = vmovshdup_avx(auVar28);
      uVar27 = auVar24._0_8_;
      local_23e0._8_8_ = uVar27;
      local_23e0._0_8_ = uVar27;
      local_23e0._16_8_ = uVar27;
      local_23e0._24_8_ = uVar27;
      auVar41 = ZEXT3264(local_23e0);
      auVar34 = vshufpd_avx(auVar28,auVar28,1);
      auVar33 = vshufps_avx(auVar28,auVar28,0xaa);
      uVar27 = auVar33._0_8_;
      local_2400._8_8_ = uVar27;
      local_2400._0_8_ = uVar27;
      local_2400._16_8_ = uVar27;
      local_2400._24_8_ = uVar27;
      auVar42 = ZEXT3264(local_2400);
      auVar35._0_4_ = fVar32 * *(float *)&This->ptr;
      auVar35._4_4_ = auVar28._4_4_ * *(float *)((long)&This->ptr + 4);
      auVar35._8_4_ = auVar28._8_4_ * *(float *)&This->leafIntersector;
      auVar35._12_4_ = auVar28._12_4_ * *(float *)((long)&This->leafIntersector + 4);
      auVar33 = vmovshdup_avx(auVar35);
      auVar28 = vshufps_avx(auVar35,auVar35,0xaa);
      local_24b8 = (ulong)(fVar32 < 0.0) << 5;
      local_24c0 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x40;
      local_24c8 = (ulong)(auVar34._0_4_ < 0.0) << 5 | 0x80;
      local_24d0 = local_24b8 ^ 0x20;
      local_24d8 = local_24c0 ^ 0x20;
      local_24a8 = local_24c8 ^ 0x20;
      uVar20 = auVar25._0_4_;
      auVar21 = ZEXT3264(CONCAT428(uVar20,CONCAT424(uVar20,CONCAT420(uVar20,CONCAT416(uVar20,
                                                  CONCAT412(uVar20,CONCAT48(uVar20,CONCAT44(uVar20,
                                                  uVar20))))))));
      uVar13 = CONCAT44(auVar35._0_4_,auVar35._0_4_);
      local_2420._0_8_ = uVar13 ^ 0x8000000080000000;
      local_2420._8_4_ = -auVar35._0_4_;
      local_2420._12_4_ = -auVar35._0_4_;
      local_2420._16_4_ = -auVar35._0_4_;
      local_2420._20_4_ = -auVar35._0_4_;
      local_2420._24_4_ = -auVar35._0_4_;
      local_2420._28_4_ = -auVar35._0_4_;
      auVar37 = ZEXT3264(local_2420);
      uVar29 = auVar33._0_4_;
      uVar31 = auVar33._4_4_;
      local_2440._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
      local_2440._8_4_ = uVar29 ^ 0x80000000;
      local_2440._12_4_ = uVar31 ^ 0x80000000;
      local_2440._16_4_ = uVar29 ^ 0x80000000;
      local_2440._20_4_ = uVar31 ^ 0x80000000;
      local_2440._24_4_ = uVar29 ^ 0x80000000;
      local_2440._28_4_ = uVar31 ^ 0x80000000;
      auVar39 = ZEXT3264(local_2440);
      uVar29 = auVar28._0_4_;
      uVar31 = auVar28._4_4_;
      local_2460._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      local_2460._8_4_ = uVar29 ^ 0x80000000;
      local_2460._12_4_ = uVar31 ^ 0x80000000;
      local_2460._16_4_ = uVar29 ^ 0x80000000;
      local_2460._20_4_ = uVar31 ^ 0x80000000;
      local_2460._24_4_ = uVar29 ^ 0x80000000;
      local_2460._28_4_ = uVar31 ^ 0x80000000;
      auVar44 = ZEXT3264(local_2460);
      uVar20 = auVar22._0_4_;
      local_2480._4_4_ = uVar20;
      local_2480._0_4_ = uVar20;
      local_2480._8_4_ = uVar20;
      local_2480._12_4_ = uVar20;
      local_2480._16_4_ = uVar20;
      local_2480._20_4_ = uVar20;
      local_2480._24_4_ = uVar20;
      local_2480._28_4_ = uVar20;
      auVar45 = ZEXT3264(local_2480);
      uVar13 = local_24d0;
      uVar14 = local_24d8;
      uVar15 = local_24b8;
      uVar16 = local_24c0;
      uVar18 = local_24c8;
      do {
        do {
          if (local_24e8 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          pauVar6 = local_24e8 + -1;
          local_24e8 = local_24e8 + -1;
        } while (*(float *)&(This->intersector1).intersect < *(float *)(*pauVar6 + 8));
        uVar19 = *(ulong *)*local_24e8;
        do {
          auVar43 = auVar44._0_32_;
          auVar38 = auVar39._0_32_;
          auVar36 = auVar37._0_32_;
          if ((uVar19 & 8) == 0) {
            uVar20 = *(undefined4 *)((long)&(This->collider).name + 4);
            auVar26._4_4_ = uVar20;
            auVar26._0_4_ = uVar20;
            auVar26._8_4_ = uVar20;
            auVar26._12_4_ = uVar20;
            auVar26._16_4_ = uVar20;
            auVar26._20_4_ = uVar20;
            auVar26._24_4_ = uVar20;
            auVar26._28_4_ = uVar20;
            uVar8 = uVar19 & 0xfffffffffffffff0;
            auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar15),auVar26,
                                      *(undefined1 (*) [32])(uVar8 + 0x40 + uVar15));
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar16),auVar26,
                                      *(undefined1 (*) [32])(uVar8 + 0x40 + uVar16));
            auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar40._0_32_,auVar36);
            auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar41._0_32_,auVar38);
            auVar2 = vpmaxsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar22));
            auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar18),auVar26,
                                      *(undefined1 (*) [32])(uVar8 + 0x40 + uVar18));
            auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar42._0_32_,auVar43);
            auVar3 = vpmaxsd_avx2(ZEXT1632(auVar24),auVar45._0_32_);
            local_24a0 = vpmaxsd_avx2(auVar2,auVar3);
            auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar13),auVar26,
                                      *(undefined1 (*) [32])(uVar8 + 0x40 + uVar13));
            auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar40._0_32_,auVar36);
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar14),auVar26,
                                      *(undefined1 (*) [32])(uVar8 + 0x40 + uVar14));
            auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar41._0_32_,auVar38);
            auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + local_24a8),auVar26,
                                      *(undefined1 (*) [32])(uVar8 + 0x40 + local_24a8));
            auVar2 = vpminsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar22));
            auVar24 = vfmadd213ps_fma(ZEXT1632(auVar25),auVar42._0_32_,auVar43);
            auVar3 = vpminsd_avx2(ZEXT1632(auVar24),auVar21._0_32_);
            auVar2 = vpminsd_avx2(auVar2,auVar3);
            auVar2 = vcmpps_avx(local_24a0,auVar2,2);
            if (((uint)uVar19 & 7) == 6) {
              auVar3 = vcmpps_avx(*(undefined1 (*) [32])(uVar8 + 0x1c0),auVar26,2);
              auVar26 = vcmpps_avx(auVar26,*(undefined1 (*) [32])(uVar8 + 0x1e0),1);
              auVar3 = vandps_avx(auVar3,auVar26);
              auVar2 = vandps_avx(auVar3,auVar2);
              auVar24 = vpackssdw_avx(auVar2._0_16_,auVar2._16_16_);
            }
            else {
              auVar24 = vpackssdw_avx(auVar2._0_16_,auVar2._16_16_);
            }
            auVar24 = vpsllw_avx(auVar24,0xf);
            auVar24 = vpacksswb_avx(auVar24,auVar24);
            context = (RayQueryContext *)
                      (ulong)(byte)(SUB161(auVar24 >> 7,0) & 1 | (SUB161(auVar24 >> 0xf,0) & 1) << 1
                                    | (SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                    (SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                    (SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                    (SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                    (SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                   SUB161(auVar24 >> 0x3f,0) << 7);
          }
          if ((uVar19 & 8) == 0) {
            if (context == (RayQueryContext *)0x0) {
              iVar7 = 4;
            }
            else {
              uVar8 = uVar19 & 0xfffffffffffffff0;
              lVar17 = 0;
              for (pRVar4 = context; ((ulong)pRVar4 & 1) == 0;
                  pRVar4 = (RayQueryContext *)((ulong)pRVar4 >> 1 | 0x8000000000000000)) {
                lVar17 = lVar17 + 1;
              }
              iVar7 = 0;
              uVar10 = (ulong)((long)&context[-1].args + 7U) & (ulong)context;
              uVar19 = *(ulong *)(uVar8 + lVar17 * 8);
              if (uVar10 != 0) {
                uVar29 = *(uint *)(local_24a0 + lVar17 * 4);
                lVar17 = 0;
                for (uVar13 = uVar10; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
                {
                  lVar17 = lVar17 + 1;
                }
                uVar10 = uVar10 - 1 & uVar10;
                uVar1 = *(ulong *)(uVar8 + lVar17 * 8);
                uVar31 = *(uint *)(local_24a0 + lVar17 * 4);
                uVar13 = local_24d0;
                uVar14 = local_24d8;
                if (uVar10 == 0) {
                  if (uVar29 < uVar31) {
                    *(ulong *)*local_24e8 = uVar1;
                    *(uint *)(*local_24e8 + 8) = uVar31;
                    local_24e8 = local_24e8 + 1;
                  }
                  else {
                    *(ulong *)*local_24e8 = uVar19;
                    *(uint *)(*local_24e8 + 8) = uVar29;
                    uVar19 = uVar1;
                    local_24e8 = local_24e8 + 1;
                  }
                }
                else {
                  auVar22._8_8_ = 0;
                  auVar22._0_8_ = uVar19;
                  auVar24 = vpunpcklqdq_avx(auVar22,ZEXT416(uVar29));
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = uVar1;
                  auVar22 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar31));
                  lVar17 = 0;
                  for (uVar19 = uVar10; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000
                      ) {
                    lVar17 = lVar17 + 1;
                  }
                  uVar10 = uVar10 - 1 & uVar10;
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = *(ulong *)(uVar8 + lVar17 * 8);
                  auVar25 = vpunpcklqdq_avx(auVar28,ZEXT416(*(uint *)(local_24a0 + lVar17 * 4)));
                  if (uVar10 == 0) {
                    auVar33 = vpcmpgtd_avx(auVar22,auVar24);
                    auVar34 = vpshufd_avx(auVar33,0xaa);
                    auVar33 = vblendvps_avx(auVar22,auVar24,auVar34);
                    auVar24 = vblendvps_avx(auVar24,auVar22,auVar34);
                    auVar22 = vpcmpgtd_avx(auVar25,auVar33);
                    auVar34 = vpshufd_avx(auVar22,0xaa);
                    auVar22 = vblendvps_avx(auVar25,auVar33,auVar34);
                    auVar25 = vblendvps_avx(auVar33,auVar25,auVar34);
                    auVar33 = vpcmpgtd_avx(auVar25,auVar24);
                    auVar34 = vpshufd_avx(auVar33,0xaa);
                    auVar33 = vblendvps_avx(auVar25,auVar24,auVar34);
                    auVar24 = vblendvps_avx(auVar24,auVar25,auVar34);
                    *local_24e8 = auVar24;
                    local_24e8[1] = auVar33;
                    uVar19 = auVar22._0_8_;
                    local_24e8 = local_24e8 + 2;
                  }
                  else {
                    lVar17 = 0;
                    for (uVar18 = uVar10; (uVar18 & 1) == 0;
                        uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                      lVar17 = lVar17 + 1;
                    }
                    uVar10 = uVar10 - 1 & uVar10;
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ = *(ulong *)(uVar8 + lVar17 * 8);
                    auVar33 = vpunpcklqdq_avx(auVar30,ZEXT416(*(uint *)(local_24a0 + lVar17 * 4)));
                    if (uVar10 == 0) {
                      auVar34 = vpcmpgtd_avx(auVar22,auVar24);
                      auVar28 = vpshufd_avx(auVar34,0xaa);
                      auVar34 = vblendvps_avx(auVar22,auVar24,auVar28);
                      auVar24 = vblendvps_avx(auVar24,auVar22,auVar28);
                      auVar22 = vpcmpgtd_avx(auVar33,auVar25);
                      auVar28 = vpshufd_avx(auVar22,0xaa);
                      auVar22 = vblendvps_avx(auVar33,auVar25,auVar28);
                      auVar25 = vblendvps_avx(auVar25,auVar33,auVar28);
                      auVar33 = vpcmpgtd_avx(auVar25,auVar24);
                      auVar28 = vpshufd_avx(auVar33,0xaa);
                      auVar33 = vblendvps_avx(auVar25,auVar24,auVar28);
                      auVar24 = vblendvps_avx(auVar24,auVar25,auVar28);
                      auVar25 = vpcmpgtd_avx(auVar22,auVar34);
                      auVar28 = vpshufd_avx(auVar25,0xaa);
                      auVar25 = vblendvps_avx(auVar22,auVar34,auVar28);
                      auVar22 = vblendvps_avx(auVar34,auVar22,auVar28);
                      auVar34 = vpcmpgtd_avx(auVar33,auVar22);
                      auVar28 = vpshufd_avx(auVar34,0xaa);
                      auVar34 = vblendvps_avx(auVar33,auVar22,auVar28);
                      auVar22 = vblendvps_avx(auVar22,auVar33,auVar28);
                      *local_24e8 = auVar24;
                      local_24e8[1] = auVar22;
                      local_24e8[2] = auVar34;
                      uVar19 = auVar25._0_8_;
                      local_24e8 = local_24e8 + 3;
                    }
                    else {
                      *local_24e8 = auVar24;
                      local_24e8[1] = auVar22;
                      local_24e8[2] = auVar25;
                      local_24e8[3] = auVar33;
                      lVar17 = 0x30;
                      do {
                        lVar11 = lVar17;
                        lVar17 = 0;
                        for (uVar18 = uVar10; (uVar18 & 1) == 0;
                            uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                          lVar17 = lVar17 + 1;
                        }
                        auVar23._8_8_ = 0;
                        auVar23._0_8_ = *(ulong *)(uVar8 + lVar17 * 8);
                        auVar24 = vpunpcklqdq_avx(auVar23,ZEXT416(*(uint *)(local_24a0 + lVar17 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(local_24e8[1] + lVar11) = auVar24;
                        uVar10 = uVar10 - 1 & uVar10;
                        lVar17 = lVar11 + 0x10;
                      } while (uVar10 != 0);
                      pauVar6 = (undefined1 (*) [16])(local_24e8[1] + lVar11);
                      if (lVar11 + 0x10 != 0) {
                        lVar17 = 0x10;
                        pauVar9 = local_24e8;
                        do {
                          uVar27 = *(undefined8 *)pauVar9[1];
                          uVar5 = *(undefined8 *)(pauVar9[1] + 8);
                          uVar29 = *(uint *)(pauVar9[1] + 8);
                          pauVar9 = pauVar9 + 1;
                          lVar11 = lVar17;
                          do {
                            if (uVar29 <= *(uint *)(local_24e8[-1] + lVar11 + 8)) {
                              pauVar12 = (undefined1 (*) [16])(*local_24e8 + lVar11);
                              break;
                            }
                            *(undefined1 (*) [16])(*local_24e8 + lVar11) =
                                 *(undefined1 (*) [16])(local_24e8[-1] + lVar11);
                            lVar11 = lVar11 + -0x10;
                            pauVar12 = local_24e8;
                          } while (lVar11 != 0);
                          *(undefined8 *)*pauVar12 = uVar27;
                          *(undefined8 *)(*pauVar12 + 8) = uVar5;
                          lVar17 = lVar17 + 0x10;
                        } while (pauVar6 != pauVar9);
                      }
                      uVar19 = *(ulong *)*pauVar6;
                      local_24e8 = pauVar6;
                    }
                    auVar37 = ZEXT3264(auVar36);
                    auVar39 = ZEXT3264(auVar38);
                    auVar44 = ZEXT3264(auVar43);
                    auVar45 = ZEXT3264(auVar45._0_32_);
                    uVar18 = local_24c8;
                  }
                }
              }
            }
          }
          else {
            iVar7 = 6;
          }
        } while (iVar7 == 0);
        if (iVar7 == 6) {
          lVar17 = (ulong)((uint)uVar19 & 0xf) - 8;
          local_24b0 = context;
          if (lVar17 != 0) {
            prim = (Primitive *)(uVar19 & 0xfffffffffffffff0);
            do {
              InstanceArrayIntersector1MB::intersect
                        (&local_24d9,(RayHit *)This,(RayQueryContext *)ray,prim);
              prim = prim + 1;
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
          }
          uVar20 = *(undefined4 *)&(This->intersector1).intersect;
          auVar21 = ZEXT3264(CONCAT428(uVar20,CONCAT424(uVar20,CONCAT420(uVar20,CONCAT416(uVar20,
                                                  CONCAT412(uVar20,CONCAT48(uVar20,CONCAT44(uVar20,
                                                  uVar20))))))));
          auVar40 = ZEXT3264(local_23c0);
          auVar41 = ZEXT3264(local_23e0);
          auVar42 = ZEXT3264(local_2400);
          auVar37 = ZEXT3264(local_2420);
          auVar39 = ZEXT3264(local_2440);
          auVar44 = ZEXT3264(local_2460);
          auVar45 = ZEXT3264(local_2480);
          context = local_24b0;
          uVar13 = local_24d0;
          uVar14 = local_24d8;
          uVar15 = local_24b8;
          uVar16 = local_24c0;
          uVar18 = local_24c8;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }